

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extraBddCas.c
# Opt level: O1

DdNode * Extra_bddEncodingNonStrict
                   (DdManager *dd,DdNode **pbColumns,int nColumns,DdNode *bVarsCol,DdNode **pCVars,
                   int nMulti,int *pSimple)

{
  int nVarsCol;
  DdNode *n;
  DdNode *n_00;
  timespec local_40;
  
  nVarsCol = Cudd_SupportSize(dd,bVarsCol);
  if (nMulti < 0x20) {
    n = Extra_bddEncodingBinary(dd,pbColumns,nColumns,pCVars,nMulti);
    Cudd_Ref(n);
    s_Field[0][0] = dd->one;
    s_Terminal = (DdNode *)((ulong)s_Field[0][0] ^ 1);
    s_EncodingVarsLevel = dd->invperm[(*pCVars)->index];
    s_BackTracks = 0;
    s_nVarsBest = 0;
    s_Encoded = n;
    s_VarAll = bVarsCol;
    s_MultiStart = nMulti;
    clock_gettime(3,&local_40);
    if (2 < nColumns) {
      EvaluateEncodings_rec(dd,bVarsCol,nVarsCol,nMulti,1);
    }
    s_pbTemp = (DdNode **)malloc((long)nColumns << 3);
    n_00 = CreateTheCodes_rec(dd,n,0,pCVars);
    Cudd_Ref(n_00);
    Cudd_RecursiveDeref(dd,n);
    if (s_pbTemp != (DdNode **)0x0) {
      free(s_pbTemp);
      s_pbTemp = (DdNode **)0x0;
    }
    *pSimple = s_nVarsBest;
    Cudd_Deref(n_00);
    return n_00;
  }
  __assert_fail("nMulti < 32",
                "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/bdd/extrab/extraBddCas.c"
                ,0xc6,
                "DdNode *Extra_bddEncodingNonStrict(DdManager *, DdNode **, int, DdNode *, DdNode **, int, int *)"
               );
}

Assistant:

DdNode * 
Extra_bddEncodingNonStrict( 
  DdManager * dd, 
  DdNode ** pbColumns,   // pbColumns is the array of columns to be encoded;
  int nColumns,          // nColumns is the number of columns in the array
  DdNode * bVarsCol,     // bVarsCol is the cube of variables on which the columns depend
  DdNode ** pCVars,      // pCVars is the array of variables to use for the codes
  int nMulti,            // nMulti is the column multiplicity, [log2(nColumns)]
  int * pSimple )        // pSimple gets the number of code variables taken from the input varibles without change
{
    DdNode * bEncoded, * bResult;
    int nVarsCol = Cudd_SupportSize(dd,bVarsCol);
    abctime clk;

    // cannot work with more that 32-bit codes
    assert( nMulti < 32 );

    // perform the preliminary encoding using the straight binary code
    bEncoded = Extra_bddEncodingBinary( dd, pbColumns, nColumns, pCVars, nMulti );   Cudd_Ref( bEncoded );
    //printf( "Node count = %d", Cudd_DagSize(bEncoded) );

    // set the backgroup value for counting minterms
    s_Terminal = b0;
    // set the level of the encoding variables
    s_EncodingVarsLevel = dd->invperm[pCVars[0]->index];

    // the current number of backtracks
    s_BackTracks = 0;
    // the variables that are cofactored on the topmost level where everything starts (no vars)
    s_Field[0][0] = b1;   
    // the size of the best set of "simple" encoding variables found so far
    s_nVarsBest   = 0;

    // set the relation to be accessible to traversal procedures
    s_Encoded = bEncoded;
    // the set of all vars to be accessible to traversal procedures
    s_VarAll  = bVarsCol;
    // the column multiplicity
    s_MultiStart  = nMulti;


    clk = Abc_Clock();
    // find the simplest encoding
    if ( nColumns > 2 )
    EvaluateEncodings_rec( dd, bVarsCol, nVarsCol, nMulti, 1 );
//  printf( "The number of backtracks = %d\n", s_BackTracks );
//  s_EncSearchTime += Abc_Clock() - clk;

    // allocate the temporary storage for the columns
    s_pbTemp = (DdNode **)ABC_ALLOC( char, nColumns * sizeof(DdNode *) );

//  clk = Abc_Clock();
    bResult = CreateTheCodes_rec( dd, bEncoded, 0, pCVars );   Cudd_Ref( bResult );
//  s_EncComputeTime += Abc_Clock() - clk;
    
    // delocate the preliminarily encoded set
    Cudd_RecursiveDeref( dd, bEncoded );
//  Cudd_RecursiveDeref( dd, aEncoded );

    ABC_FREE( s_pbTemp );

    *pSimple = s_nVarsBest;
    Cudd_Deref( bResult );
    return bResult;
}